

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# socket_server.c
# Opt level: O0

int start_socket(socket_server *ss,request_start *request,socket_message *result)

{
  uint uVar1;
  uint16_t uVar2;
  int iVar3;
  socket *ud;
  int *piVar4;
  char *pcVar5;
  socket *s;
  int id;
  socket_message *result_local;
  request_start *request_local;
  socket_server *ss_local;
  
  uVar1 = request->id;
  result->id = uVar1;
  result->opaque = request->opaque;
  result->ud = 0;
  result->data = (char *)0x0;
  ud = ss->slot + (uVar1 & 0xffff);
  if ((ud->type == 0) || (ud->id != uVar1)) {
    result->data = "invalid socket";
    ss_local._4_4_ = 4;
  }
  else if ((ud->type == 7) || (ud->type == 2)) {
    iVar3 = sp_add(ss->event_fd,ud->fd,ud);
    if (iVar3 == 0) {
      uVar2 = 3;
      if (ud->type == 7) {
        uVar2 = 5;
      }
      ud->type = uVar2;
      ud->opaque = request->opaque;
      result->data = "start";
      ss_local._4_4_ = 2;
    }
    else {
      ud->type = 0;
      piVar4 = __errno_location();
      pcVar5 = strerror(*piVar4);
      result->data = pcVar5;
      ss_local._4_4_ = 4;
    }
  }
  else if (ud->type == 5) {
    ud->opaque = request->opaque;
    result->data = "transfer";
    ss_local._4_4_ = 2;
  }
  else {
    ss_local._4_4_ = -1;
  }
  return ss_local._4_4_;
}

Assistant:

static int
start_socket(struct socket_server *ss, struct request_start *request, struct socket_message *result) {
	int id = request->id;
	result->id = id;
	result->opaque = request->opaque;
	result->ud = 0;
	result->data = NULL;
	struct socket *s = &ss->slot[HASH_ID(id)];
	if (s->type == SOCKET_TYPE_INVALID || s->id !=id) {
		result->data = "invalid socket";
		return SOCKET_ERROR;
	}
	if (s->type == SOCKET_TYPE_PACCEPT || s->type == SOCKET_TYPE_PLISTEN) {
		if (sp_add(ss->event_fd, s->fd, s)) {
			s->type = SOCKET_TYPE_INVALID;
			result->data = strerror(errno);
			return SOCKET_ERROR;
		}
		s->type = (s->type == SOCKET_TYPE_PACCEPT) ? SOCKET_TYPE_CONNECTED : SOCKET_TYPE_LISTEN;
		s->opaque = request->opaque;
		result->data = "start";
		return SOCKET_OPEN;
	} else if (s->type == SOCKET_TYPE_CONNECTED) {
		s->opaque = request->opaque;
		result->data = "transfer";
		return SOCKET_OPEN;
	}
	return -1;
}